

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 242_validAnagrams.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *this;
  string local_b0;
  string local_90;
  allocator<char> local_69;
  string local_68 [8];
  string s2;
  allocator<char> local_31;
  string local_30 [8];
  string s;
  
  s.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"anagram",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"naagram",&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::string((string *)&local_90,local_30);
  std::__cxx11::string::string((string *)&local_b0,local_68);
  bVar1 = isAnagram(&local_90,&local_b0);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  s.field_2._12_4_ = 0;
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return s.field_2._12_4_;
}

Assistant:

int main()
{
	string s="anagram",s2="naagram";
	cout<<isAnagram(s,s2)<<endl;
	return 0;
}